

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O2

void initialize_F(void)

{
  int state;
  uint uVar1;
  shifts *psVar2;
  int iVar3;
  Yshort **relation;
  char *__ptr;
  Yshort *pYVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  
  F = (uint *)allocate(ngotos * tokensetsize * 4);
  relation = (Yshort **)allocate(ngotos << 3);
  __ptr = allocate(ngotos * 4 + 4);
  puVar5 = F;
  for (lVar9 = 0; pYVar4 = accessing_symbol, lVar9 < ngotos; lVar9 = lVar9 + 1) {
    state = to_state[lVar9];
    psVar2 = shift_table[state];
    if (psVar2 != (shifts *)0x0) {
      uVar1 = psVar2->nshifts;
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      uVar6 = 0;
      while ((uVar8 = uVar7, uVar7 != uVar6 &&
             (iVar10 = pYVar4[psVar2->shift[uVar6]], uVar8 = uVar6, iVar10 < start_symbol))) {
        puVar5[iVar10 >> 5] = puVar5[iVar10 >> 5] | 1 << ((byte)iVar10 & 0x1f);
        uVar6 = uVar6 + 1;
      }
      uVar7 = 0;
      while( true ) {
        iVar10 = (int)uVar7;
        if ((long)(int)uVar1 <= (long)uVar8) break;
        if (nullable[accessing_symbol[psVar2->shift[uVar8]]] != '\0') {
          iVar3 = map_goto(state,accessing_symbol[psVar2->shift[uVar8]]);
          uVar7 = (ulong)(iVar10 + 1);
          *(int *)(__ptr + (long)iVar10 * 4) = iVar3;
        }
        uVar8 = uVar8 + 1;
      }
      if (iVar10 != 0) {
        pYVar4 = (Yshort *)allocate(iVar10 * 4 + 4);
        relation[lVar9] = pYVar4;
        if (iVar10 < 1) {
          uVar7 = 0;
        }
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          pYVar4[uVar6] = *(Yshort *)(__ptr + uVar6 * 4);
        }
        pYVar4[iVar10] = -1;
      }
    }
    puVar5 = puVar5 + tokensetsize;
  }
  *F = *F | 1;
  digraph(relation);
  uVar6 = 0;
  uVar7 = (ulong)(uint)ngotos;
  if (ngotos < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    free(relation[uVar6]);
  }
  free(relation);
  free(__ptr);
  return;
}

Assistant:

void initialize_F()
{
  register int i;
  register int j;
  register int k;
  register shifts *sp;
  register Yshort *edge;
  register unsigned *rowp;
  register Yshort *rp;
  register Yshort **reads;
  register int nedges;
  register int stateno;
  register int symbol;
  register int nwords;

  nwords = ngotos * tokensetsize;
  F = NEW2(nwords, unsigned);

  reads = NEW2(ngotos, Yshort *);
  edge = NEW2(ngotos + 1, Yshort);
  nedges = 0;

  rowp = F;
  for (i = 0; i < ngotos; i++)
    {
      stateno = to_state[i];
      sp = shift_table[stateno];

      if (sp)
	{
	  k = sp->nshifts;

	  for (j = 0; j < k; j++)
	    {
	      symbol = accessing_symbol[sp->shift[j]];
	      if (ISVAR(symbol))
		break;
	      SETBIT(rowp, symbol);
	    }

	  for (; j < k; j++)
	    {
	      symbol = accessing_symbol[sp->shift[j]];
	      if (nullable[symbol])
		edge[nedges++] = map_goto(stateno, symbol);
	    }
	
	  if (nedges)
	    {
	      reads[i] = rp = NEW2(nedges + 1, Yshort);

	      for (j = 0; j < nedges; j++)
		rp[j] = edge[j];

	      rp[nedges] = -1;
	      nedges = 0;
	    }
	}

      rowp += tokensetsize;
    }

  SETBIT(F, 0);
  digraph(reads);

  for (i = 0; i < ngotos; i++)
    {
      if (reads[i])
	FREE(reads[i]);
    }

  FREE(reads);
  FREE(edge);
}